

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O0

void stm_releasereader(stm_object *obj)

{
  int *piVar1;
  int iVar2;
  stm_object *obj_local;
  
  rwlock_rlock(&obj->lock);
  LOCK();
  piVar1 = &obj->reference;
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (iVar2 == 1) {
    if (obj->copy != (stm_copy *)0x0) {
      __assert_fail("obj->copy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                    ,0x4c,"void stm_releasereader(struct stm_object *)");
    }
    free(obj);
  }
  else {
    rwlock_runlock(&obj->lock);
  }
  return;
}

Assistant:

static void
stm_releasereader(struct stm_object *obj) {
	rwlock_rlock(&obj->lock);
	if (ATOM_DEC(&obj->reference) == 0) {
		// last reader, no writer. so no need to unlock
		assert(obj->copy == NULL);
		skynet_free(obj);
		return;
	}
	rwlock_runlock(&obj->lock);
}